

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadSamplesProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *pcVar3;
  char local_428 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Samples-Program}\n");
  fflush(_stdout);
  djgp_push_string(program_00,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  if (g_sphere.samples.scheme == 1) {
    djgp_push_string(program_00,"#define SCHEME_GGX 1\n");
    pcVar3 = strcat2(local_428,g_app.dir.shader,"ggx.glsl");
    djgp_push_file(program_00,pcVar3);
  }
  pcVar3 = strcat2(local_428,g_app.dir.shader,"samples.glsl");
  djgp_push_file(program_00,pcVar3);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs + 4);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[0xf] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_Dir");
    g_gl.uniforms[0x10] = (*glad_glGetUniformLocation)(g_gl.programs[4],"u_Alpha");
    configureSamplesProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadSamplesProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_SAMPLES];
    char buf[1024];

    LOG("Loading {Samples-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    if (g_sphere.samples.scheme == SCHEME_GGX) {
        djgp_push_string(djp, "#define SCHEME_GGX 1\n");
        djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "ggx.glsl"));
    }
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "samples.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_SAMPLES_DIR] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SAMPLES], "u_Dir");
    g_gl.uniforms[UNIFORM_SAMPLES_ALPHA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_SAMPLES], "u_Alpha");

    configureSamplesProgram();

    return (glGetError() == GL_NO_ERROR);
}